

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall asl::PacketSocket_::readFrom(PacketSocket_ *this,InetAddress *a,void *data,int n)

{
  int *piVar1;
  uchar *puVar2;
  sockaddr *__addr;
  uchar *puVar3;
  ssize_t sVar4;
  socklen_t len;
  InetAddress local_38;
  
  if (*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc < 0) {
    Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  }
  InetAddress::InetAddress(&local_38,(this->super_Socket_)._family);
  puVar2 = (a->_data)._a;
  puVar3 = (uchar *)CONCAT44(local_38._data._a._4_4_,local_38._data._a._0_4_);
  if (puVar2 != puVar3) {
    LOCK();
    piVar1 = (int *)(puVar2 + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free((a->_data)._a + -0x10);
    }
    (a->_data)._a = (uchar *)CONCAT44(local_38._data._a._4_4_,local_38._data._a._0_4_);
    LOCK();
    piVar1 = (int *)((uchar *)CONCAT44(local_38._data._a._4_4_,local_38._data._a._0_4_) + -8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    puVar3 = (uchar *)CONCAT44(local_38._data._a._4_4_,local_38._data._a._0_4_);
  }
  a->_type = local_38._type;
  LOCK();
  piVar1 = (int *)(puVar3 + -8);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free((void *)(CONCAT44(local_38._data._a._4_4_,local_38._data._a._0_4_) + -0x10));
  }
  __addr = (sockaddr *)(a->_data)._a;
  local_38._data._a._0_2_ = __addr[-1].sa_family;
  local_38._data._a._2_1_ = __addr[-1].sa_data[0];
  local_38._data._a._3_1_ = __addr[-1].sa_data[1];
  sVar4 = recvfrom(*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc,data,(long)n,0,__addr
                   ,(socklen_t *)&local_38);
  return (int)sVar4;
}

Assistant:

int PacketSocket_::readFrom(InetAddress& a, void* data, int n)
{
	if (_handle < 0)
		init();
	a = InetAddress(_family);
	socklen_t len = (socklen_t)a.length();
	int r= recvfrom(_handle, (char*)data, n, 0, (sockaddr*)a.ptr(), &len);
	return r;
}